

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O0

int __thiscall
glslang::TIntermediate::checkLocationRange
          (TIntermediate *this,int set,TIoRange *range,TType *type,bool *typeCollision)

{
  ulong uVar1;
  bool bVar2;
  TBasicType TVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int *piVar7;
  ulong local_50;
  size_t r_1;
  ulong uStack_40;
  int againstSet;
  size_t r;
  bool *typeCollision_local;
  TType *type_local;
  TIoRange *range_local;
  int set_local;
  TIntermediate *this_local;
  
  uStack_40 = 0;
  do {
    sVar5 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::size
                      (this->usedIo + set);
    if (sVar5 <= uStack_40) {
      if ((set == 4) || (set == 1)) {
        iVar4 = 4;
        if (set == 4) {
          iVar4 = 1;
        }
        for (local_50 = 0;
            sVar5 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::size
                              (this->usedIo + iVar4), local_50 < sVar5; local_50 = local_50 + 1) {
          pvVar6 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::operator[]
                             (this->usedIo + iVar4,local_50);
          bVar2 = TRange::overlap(&range->location,&pvVar6->location);
          if (bVar2) {
            TVar3 = (*type->_vptr_TType[7])();
            pvVar6 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::operator[]
                               (this->usedIo + iVar4,local_50);
            if (TVar3 != pvVar6->basicType) {
              *typeCollision = true;
              pvVar6 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::
                       operator[](this->usedIo + iVar4,local_50);
              piVar7 = std::max<int>((int *)range,(int *)pvVar6);
              return *piVar7;
            }
          }
        }
      }
      return -1;
    }
    pvVar6 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::operator[]
                       (this->usedIo + set,uStack_40);
    bVar2 = TIoRange::overlap(range,pvVar6);
    if (bVar2) {
      pvVar6 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::operator[]
                         (this->usedIo + set,uStack_40);
      piVar7 = std::max<int>((int *)range,(int *)pvVar6);
      return *piVar7;
    }
    pvVar6 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::operator[]
                       (this->usedIo + set,uStack_40);
    bVar2 = TRange::overlap(&range->location,&pvVar6->location);
    if (bVar2) {
      TVar3 = (*type->_vptr_TType[7])();
      pvVar6 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::operator[]
                         (this->usedIo + set,uStack_40);
      bVar2 = checkCompatibleTypes(TVar3,pvVar6->basicType);
      if (!bVar2) {
LAB_006007cb:
        *typeCollision = true;
        pvVar6 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::operator[]
                           (this->usedIo + set,uStack_40);
        piVar7 = std::max<int>((int *)range,(int *)pvVar6);
        return *piVar7;
      }
      iVar4 = (*type->_vptr_TType[0xb])();
      uVar1 = *(ulong *)(CONCAT44(extraout_var,iVar4) + 8);
      pvVar6 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::operator[]
                         (this->usedIo + set,uStack_40);
      if (((byte)(uVar1 >> 0x1d) & 1) != (pvVar6->centroid & 1U)) goto LAB_006007cb;
      iVar4 = (*type->_vptr_TType[0xb])();
      uVar1 = *(ulong *)(CONCAT44(extraout_var_00,iVar4) + 8);
      pvVar6 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::operator[]
                         (this->usedIo + set,uStack_40);
      if (((byte)(uVar1 >> 0x1e) & 1) != (pvVar6->smooth & 1U)) goto LAB_006007cb;
      iVar4 = (*type->_vptr_TType[0xb])();
      uVar1 = *(ulong *)(CONCAT44(extraout_var_01,iVar4) + 8);
      pvVar6 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::operator[]
                         (this->usedIo + set,uStack_40);
      if (((byte)(uVar1 >> 0x1f) & 1) != (pvVar6->flat & 1U)) goto LAB_006007cb;
      iVar4 = (*type->_vptr_TType[0xb])();
      uVar1 = *(ulong *)(CONCAT44(extraout_var_02,iVar4) + 8);
      pvVar6 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::operator[]
                         (this->usedIo + set,uStack_40);
      if (((byte)(uVar1 >> 0x2d) & 1) != (pvVar6->sample & 1U)) goto LAB_006007cb;
      iVar4 = (*type->_vptr_TType[0xb])();
      uVar1 = *(ulong *)(CONCAT44(extraout_var_03,iVar4) + 8);
      pvVar6 = std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::operator[]
                         (this->usedIo + set,uStack_40);
      if (((byte)(uVar1 >> 0x2c) & 1) != (pvVar6->patch & 1U)) goto LAB_006007cb;
    }
    uStack_40 = uStack_40 + 1;
  } while( true );
}

Assistant:

int TIntermediate::checkLocationRange(int set, const TIoRange& range, const TType& type, bool& typeCollision)
{
    for (size_t r = 0; r < usedIo[set].size(); ++r) {
        if (range.overlap(usedIo[set][r])) {
            // there is a collision; pick one
            return std::max(range.location.start, usedIo[set][r].location.start);
        } else if (range.location.overlap(usedIo[set][r].location) &&
                   (!checkCompatibleTypes(type.getBasicType(), usedIo[set][r].basicType) ||
                    type.getQualifier().centroid != usedIo[set][r].centroid ||
                    type.getQualifier().smooth != usedIo[set][r].smooth ||
                    type.getQualifier().flat != usedIo[set][r].flat ||
                    type.getQualifier().sample != usedIo[set][r].sample ||
                    type.getQualifier().patch != usedIo[set][r].patch)) {
            // aliased-type mismatch
            typeCollision = true;
            return std::max(range.location.start, usedIo[set][r].location.start);
        }
    }

    // check typeCollision between tileImageEXT and out
    if (set == 4 || set == 1) {
      // if the set is "tileImageEXT", check against "out" and vice versa
      int againstSet = (set == 4) ? 1 : 4;
      for (size_t r = 0; r < usedIo[againstSet].size(); ++r) {
        if (range.location.overlap(usedIo[againstSet][r].location) && type.getBasicType() != usedIo[againstSet][r].basicType) {
            // aliased-type mismatch
            typeCollision = true;
            return std::max(range.location.start, usedIo[againstSet][r].location.start);
        }
      }
    }

    return -1; // no collision
}